

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O0

Result_Type
chaiscript::boxed_cast<henson::ProcMap_const&>
          (Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  Type_Info t_from;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  Result_Type pPVar5;
  undefined8 uVar6;
  Type_Info *pTVar7;
  long in_RSI;
  bad_any_cast *anon_var_0_1;
  bad_any_cast *anon_var_0;
  Type_Conversions_State *in_stack_fffffffffffffeb8;
  Boxed_Value *in_stack_fffffffffffffec0;
  Type_Info *in_stack_fffffffffffffec8;
  Type_Info *in_stack_fffffffffffffed0;
  Type_Conversions *in_stack_fffffffffffffee0;
  byte local_c9;
  Type_Info *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff60;
  Boxed_Value *in_stack_ffffffffffffffa8;
  Conversion_Saves *in_stack_ffffffffffffffb0;
  Type_Conversions *in_stack_ffffffffffffffb8;
  
  local_c9 = 1;
  if (in_RSI != 0) {
    in_stack_ffffffffffffff38 = Boxed_Value::get_type_info((Boxed_Value *)0x30edf8);
    user_type<henson::ProcMap_const&>();
    bVar4 = Type_Info::bare_equal(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_c9 = 1;
    if ((!bVar4) && (local_c9 = 0, in_RSI != 0)) {
      Type_Conversions_State::operator->((Type_Conversions_State *)0x30ee50);
      bVar4 = Type_Conversions::convertable_type<henson::ProcMap_const&>(in_stack_fffffffffffffee0);
      local_c9 = bVar4 ^ 0xff;
    }
  }
  if ((local_c9 & 1) == 0) {
    if (in_RSI != 0) {
      Type_Conversions_State::operator->((Type_Conversions_State *)0x30ef04);
      bVar4 = Type_Conversions::convertable_type<henson::ProcMap_const&>(in_stack_fffffffffffffee0);
      if (bVar4) {
        Type_Conversions_State::operator->((Type_Conversions_State *)0x30ef22);
        Type_Conversions_State::saves((Type_Conversions_State *)0x30ef34);
        Type_Conversions::boxed_type_conversion<henson::ProcMap_const&>
                  (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        pPVar5 = detail::Cast_Helper<const_henson::ProcMap_&>::cast
                           (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        Boxed_Value::~Boxed_Value((Boxed_Value *)0x30ef92);
        return pPVar5;
      }
    }
    uVar6 = __cxa_allocate_exception(0x48);
    pTVar7 = Boxed_Value::get_type_info((Boxed_Value *)0x30f1d2);
    uVar1 = pTVar7->m_bare_type_info;
    uVar2 = pTVar7->m_flags;
    uVar3 = *(undefined4 *)&pTVar7->field_0x14;
    t_from.m_bare_type_info._4_4_ = uVar3;
    t_from.m_bare_type_info._0_4_ = uVar2;
    t_from.m_type_info = (type_info *)uVar1;
    t_from._16_8_ = in_stack_ffffffffffffff60;
    exception::bad_boxed_cast::bad_boxed_cast
              ((bad_boxed_cast *)CONCAT17(local_c9,in_stack_ffffffffffffff40),t_from,
               (type_info *)in_stack_ffffffffffffff38);
    __cxa_throw(uVar6,&exception::bad_boxed_cast::typeinfo,
                exception::bad_boxed_cast::~bad_boxed_cast);
  }
  pPVar5 = detail::Cast_Helper<const_henson::ProcMap_&>::cast
                     (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  return pPVar5;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr)
  {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }


    if (t_conversions && (*t_conversions)->convertable_type<Type>())
    {
      try {
        // std::cout << "trying an up conversion " << typeid(Type).name() << '\n';
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions);
      } catch (...) {
        try {
        //  std::cout << "trying a down conversion " << typeid(Type).name() << '\n';
          // try going the other way - down the inheritance graph
          return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv), t_conversions);
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not polymorphic, just throw the error, don't waste the time on the 
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }

  }